

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_headers_add_pad(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  ssize_t sVar2;
  size_t padlen_00;
  size_t local_58;
  size_t max_payloadlen;
  size_t padlen;
  nghttp2_bufs *framebufs;
  nghttp2_active_outbound_item *aob;
  ssize_t padded_payloadlen;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).length + 0x100 < 0x4001) {
    local_58 = (frame->hd).length + 0x100;
  }
  else {
    local_58 = 0x4000;
  }
  sVar2 = session_call_select_padding(session,frame,local_58);
  session_local._4_4_ = (int)sVar2;
  iVar1 = nghttp2_is_fatal(session_local._4_4_);
  if (iVar1 == 0) {
    padlen_00 = sVar2 - (frame->hd).length;
    session_local._4_4_ = nghttp2_frame_add_pad(&(session->aob).framebufs,&frame->hd,padlen_00,0);
    if (session_local._4_4_ == 0) {
      (frame->data).padlen = padlen_00;
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_headers_add_pad(nghttp2_session *session,
                                   nghttp2_frame *frame) {
  int rv;
  ssize_t padded_payloadlen;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  size_t padlen;
  size_t max_payloadlen;

  aob = &session->aob;
  framebufs = &aob->framebufs;

  max_payloadlen = nghttp2_min(NGHTTP2_MAX_PAYLOADLEN,
                               frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
      session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  padlen = (size_t)padded_payloadlen - frame->hd.length;

  DEBUGF("send: padding selected: payloadlen=%zd, padlen=%zu\n",
         padded_payloadlen, padlen);

  rv = nghttp2_frame_add_pad(framebufs, &frame->hd, padlen, 0);

  if (rv != 0) {
    return rv;
  }

  frame->headers.padlen = padlen;

  return 0;
}